

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O3

void __thiscall ZippedFile::ZippedFile(ZippedFile *this,ITypeManager *type_manager,string *file)

{
  pointer pcVar1;
  
  (this->super_IContainedElement).type_manager_ = type_manager;
  (this->super_IContainedElement)._vptr_IContainedElement = (_func_int **)&PTR__ZippedFile_001cd5f0;
  (this->file_name_)._M_dataplus._M_p = (pointer)&(this->file_name_).field_2;
  pcVar1 = (file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->file_name_,pcVar1,pcVar1 + file->_M_string_length);
  (this->zip_file_)._vptr_NodeFS = (_func_int **)&PTR__NodeFS_001cd530;
  (this->zip_file_).name_._M_dataplus._M_p = (pointer)&(this->zip_file_).name_.field_2;
  (this->zip_file_).name_._M_string_length = 0;
  (this->zip_file_).name_.field_2._M_local_buf[0] = '\0';
  (this->zip_file_).sub_node_.super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->zip_file_).sub_node_.super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->zip_file_).sub_node_.super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->zip_file_).offset_ = 0;
  (this->zip_file_).buffer_ = (uchar *)0x0;
  (this->zip_file_).type_ = -1;
  InitUnzip(this);
  return;
}

Assistant:

ZippedFile::ZippedFile(ITypeManager* type_manager, const std::string& file) : IContainedElement(type_manager),
                                                                              file_name_(file)
{
   // Unzip to file
   InitUnzip();
}